

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjRetimeFwd(Rtm_Man_t *pRtm,Rtm_Obj_t *pObj)

{
  int iVar1;
  Rtm_Init_t RVar2;
  Rtm_Edg_t *pRVar3;
  uint local_38;
  int local_2c;
  int i;
  Rtm_Edg_t *pEdge;
  Rtm_Init_t ValCur;
  Rtm_Init_t ValTotal;
  Rtm_Obj_t *pObj_local;
  Rtm_Man_t *pRtm_local;
  
  iVar1 = Rtm_ObjCheckRetimeFwd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Rtm_ObjCheckRetimeFwd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                  ,0x208,"void Rtm_ObjRetimeFwd(Rtm_Man_t *, Rtm_Obj_t *)");
  }
  pEdge._4_4_ = RTM_VAL_ONE;
  for (local_2c = 0; local_2c < (int)(*(uint *)&pObj->field_0x8 >> 7 & 0xff);
      local_2c = local_2c + 1) {
    pRVar3 = Rtm_ObjEdge(pObj,local_2c);
    RVar2 = Rtm_ObjRemFirst(pRtm,pRVar3);
    if (local_2c == 0) {
      local_38 = *(uint *)&pObj->field_0x8 >> 5;
    }
    else {
      local_38 = *(uint *)&pObj->field_0x8 >> 6;
    }
    local_38 = local_38 & 1;
    RVar2 = Rtm_InitNotCond(RVar2,local_38);
    pEdge._4_4_ = Rtm_InitAnd(pEdge._4_4_,RVar2);
  }
  for (local_2c = 0; local_2c < pObj->nFanouts; local_2c = local_2c + 1) {
    pRVar3 = Rtm_ObjFanoutEdge(pObj,local_2c);
    Rtm_ObjAddLast(pRtm,pRVar3,pEdge._4_4_);
  }
  return;
}

Assistant:

void Rtm_ObjRetimeFwd( Rtm_Man_t * pRtm, Rtm_Obj_t * pObj )
{
    Rtm_Init_t ValTotal, ValCur;
    Rtm_Edg_t * pEdge;
    int i;
    assert( Rtm_ObjCheckRetimeFwd(pObj) );
    // extract values and compute the result
    ValTotal = RTM_VAL_ONE;
    Rtm_ObjForEachFaninEdge( pObj, pEdge, i )
    {
        ValCur = Rtm_ObjRemFirst( pRtm, pEdge );
        ValCur = Rtm_InitNotCond( ValCur, i? pObj->fCompl1 : pObj->fCompl0 );
        ValTotal = Rtm_InitAnd( ValTotal, ValCur );
    }
    // insert the result in the fanout values
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        Rtm_ObjAddLast( pRtm, pEdge, ValTotal );
}